

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QMainWindowLayout::toggleToolBarsVisible(QMainWindowLayout *this)

{
  undefined8 uVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  QWidget *pQVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  Representation local_48;
  Representation RStack_44;
  undefined1 *local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this[0x198] = (QMainWindowLayout)((byte)this[0x198] ^ 1);
  bVar3 = QWidget::isMaximized(*(QWidget **)(this + 0x98));
  if (bVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QLayout::update((QLayout *)this);
      return;
    }
  }
  else {
    pQVar4 = QLayout::parentWidget((QLayout *)this);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    uVar1._0_4_ = (pQVar4->data->crect).x1.m_i;
    uVar1._4_4_ = (pQVar4->data->crect).y1.m_i;
    pQVar4 = QLayout::parentWidget((QLayout *)this);
    pQVar2 = pQVar4->data;
    local_38._0_4_ = (pQVar2->crect).x1.m_i;
    local_38._4_4_ = (pQVar2->crect).y1.m_i;
    uStack_30._0_4_ = (pQVar2->crect).x2.m_i;
    uStack_30._4_4_ = (pQVar2->crect).y2.m_i;
    QVar5 = QToolBarAreaLayout::rectHint((QToolBarAreaLayout *)(this + 0xa0),(QRect *)&local_38);
    uStack_30._4_4_ = QVar5.y2.m_i.m_i + (uVar1._4_4_ - QVar5.y1.m_i);
    uStack_30._0_4_ = QVar5.x2.m_i.m_i + (uVar1._0_4_ - QVar5.x1.m_i);
    local_38 = (undefined1 *)uVar1;
    pQVar4 = QLayout::parentWidget((QLayout *)this);
    QWidget::setGeometry(pQVar4,(QRect *)&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::toggleToolBarsVisible()
{
    layoutState.toolBarAreaLayout.visible = !layoutState.toolBarAreaLayout.visible;
    if (!layoutState.mainWindow->isMaximized()) {
        QPoint topLeft = parentWidget()->geometry().topLeft();
        QRect r = parentWidget()->geometry();
        r = layoutState.toolBarAreaLayout.rectHint(r);
        r.moveTo(topLeft);
        parentWidget()->setGeometry(r);
    } else {
        update();
    }
}